

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O3

void __thiscall fc_layer_t::activate(fc_layer_t *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  int iVar4;
  long lVar5;
  int _x;
  int _y;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [64];
  
  if (0 < (this->super_layer_t).out.size.x) {
    lVar5 = 0;
    do {
      iVar4 = (this->super_layer_t).in.size.x;
      if (iVar4 < 1) {
        auVar7 = ZEXT816(0);
      }
      else {
        iVar6 = (this->super_layer_t).in.size.y;
        _x = 0;
        auVar9 = ZEXT864(0);
        do {
          if (0 < iVar6) {
            iVar4 = (this->super_layer_t).in.size.z;
            _y = 0;
            do {
              if (0 < iVar4) {
                iVar6 = 0;
                do {
                  iVar4 = (this->super_layer_t).in.size.y;
                  iVar1 = (this->super_layer_t).in.size.x;
                  pfVar3 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,iVar6);
                  fVar8 = *pfVar3;
                  pfVar3 = tensor_t<float>::get
                                     (&this->weights,(iVar4 * iVar6 + _y) * iVar1 + _x,(int)lVar5,0)
                  ;
                  auVar7 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)fVar8),ZEXT416((uint)*pfVar3)
                                          );
                  auVar9 = ZEXT1664(auVar7);
                  iVar6 = iVar6 + 1;
                  iVar4 = (this->super_layer_t).in.size.z;
                } while (iVar6 < iVar4);
                iVar6 = (this->super_layer_t).in.size.y;
              }
              _y = _y + 1;
            } while (_y < iVar6);
            iVar4 = (this->super_layer_t).in.size.x;
          }
          auVar7 = auVar9._0_16_;
          _x = _x + 1;
        } while (_x < iVar4);
      }
      (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = auVar7._0_4_;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar7 = vxorps_avx512vl(auVar7,auVar2);
      fVar8 = expf(auVar7._0_4_);
      pfVar3 = tensor_t<float>::get(&(this->super_layer_t).out,(int)lVar5,0,0);
      *pfVar3 = 1.0 / (fVar8 + 1.0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void activate() {
    for (int n = 0; n < out.size.x; n++) {
      float inputv = 0;

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            inputv += in(i, j, z) * weights(m, n, 0);
          }

      input[n] = inputv;

      // activate function
      out(n, 0, 0) = activator_function(inputv);
    }
  }